

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O1

int nng_socket_close(nng_socket s)

{
  int iVar1;
  nni_sock *local_10;
  nni_sock *sock;
  
  iVar1 = nni_sock_find(&local_10,s.id);
  if (iVar1 == 0) {
    nni_sock_close(local_10);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int
nng_socket_close(nng_socket s)
{
	int       rv;
	nni_sock *sock;

	// Close is special, because we still want to be able to get
	// a hold on the socket even if shutdown was called.
	if ((rv = nni_sock_find(&sock, s.id)) != 0) {
		return (rv);
	}
	// No release -- close releases it.
	nni_sock_close(sock);
	return (0);
}